

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
     ::tests(ostream *param_1)

{
  lf_heterogeneous_queue_lifetime_tests();
  lf_heterogeneous_queue_basic_nonpolymorphic_base_tests();
  lf_heterogeneous_queue_basic_polymorphic_base_tests();
  NbQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::
  lf_heterogeneous_queue_basic_void_tests<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>
            ();
  NbQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::
  lf_heterogeneous_queue_basic_void_tests<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>
            ();
  NbQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::
  lf_heterogeneous_queue_basic_void_tests<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>
            ();
  return;
}

Assistant:

static void tests(std::ostream & /*i_ostream*/)
        {
            using density::runtime_type;

            lf_heterogeneous_queue_lifetime_tests();

            lf_heterogeneous_queue_basic_nonpolymorphic_base_tests();

            lf_heterogeneous_queue_basic_polymorphic_base_tests();

            lf_heterogeneous_queue_basic_void_tests<LfHeterQueue<>>();

            lf_heterogeneous_queue_basic_void_tests<
              LfHeterQueue<runtime_type<>, UnmovableFastTestAllocator<>>>();

            lf_heterogeneous_queue_basic_void_tests<
              LfHeterQueue<TestRuntimeTime<>, DeepTestAllocator<>>>();
        }